

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

void yaml_parser_set_input_file(yaml_parser_t *parser,FILE *file)

{
  FILE *file_local;
  yaml_parser_t *parser_local;
  
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x137,"void yaml_parser_set_input_file(yaml_parser_t *, FILE *)");
  }
  if (parser->read_handler == (yaml_read_handler_t *)0x0) {
    if (file != (FILE *)0x0) {
      parser->read_handler = yaml_file_read_handler;
      parser->read_handler_data = parser;
      (parser->input).file = file;
      return;
    }
    __assert_fail("file",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x139,"void yaml_parser_set_input_file(yaml_parser_t *, FILE *)");
  }
  __assert_fail("!parser->read_handler",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x138,"void yaml_parser_set_input_file(yaml_parser_t *, FILE *)");
}

Assistant:

YAML_DECLARE(void)
yaml_parser_set_input_file(yaml_parser_t *parser, FILE *file)
{
    assert(parser); /* Non-NULL parser object expected. */
    assert(!parser->read_handler);  /* You can set the source only once. */
    assert(file);   /* Non-NULL file object expected. */

    parser->read_handler = yaml_file_read_handler;
    parser->read_handler_data = parser;

    parser->input.file = file;
}